

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O0

XmlAttributePtr __thiscall libcellml::XmlNode::firstAttribute(XmlNode *this)

{
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined8 *in_RSI;
  XmlAttributePtr XVar2;
  shared_ptr<libcellml::XmlAttribute> local_38;
  undefined1 local_21;
  xmlAttrPtr local_20;
  xmlAttrPtr attribute;
  XmlNode *this_local;
  XmlAttributePtr *attributeHandle;
  
  local_20 = *(xmlAttrPtr *)(*(long *)*in_RSI + 0x58);
  local_21 = 0;
  this_local = this;
  std::shared_ptr<libcellml::XmlAttribute>::shared_ptr
            ((shared_ptr<libcellml::XmlAttribute> *)this,(nullptr_t)0x0);
  _Var1._M_pi = extraout_RDX;
  if (local_20 != (xmlAttrPtr)0x0) {
    std::make_shared<libcellml::XmlAttribute>();
    std::shared_ptr<libcellml::XmlAttribute>::operator=
              ((shared_ptr<libcellml::XmlAttribute> *)this,&local_38);
    std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr(&local_38);
    this_00 = std::
              __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    XmlAttribute::setXmlAttribute(this_00,&local_20);
    _Var1._M_pi = extraout_RDX_00;
  }
  XVar2.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  XVar2.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (XmlAttributePtr)
         XVar2.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlAttributePtr XmlNode::firstAttribute() const
{
    xmlAttrPtr attribute = mPimpl->mXmlNodePtr->properties;
    XmlAttributePtr attributeHandle = nullptr;
    if (attribute != nullptr) {
        attributeHandle = std::make_shared<XmlAttribute>();
        attributeHandle->setXmlAttribute(attribute);
    }
    return attributeHandle;
}